

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vocwset(voccxdef *ctx,vocdef *v,prpnum p,objnum objn,int classflg)

{
  uint uVar1;
  uchar *puVar2;
  char *pcVar3;
  short in_CX;
  ushort in_DX;
  long in_RSI;
  errcxdef *in_RDI;
  byte in_R8B;
  int pg;
  vocwdef *vw2;
  uint inx;
  vocwdef *vw;
  errcxdef *in_stack_ffffffffffffff08;
  int err;
  errcxdef *in_stack_ffffffffffffff10;
  int len;
  char *in_stack_ffffffffffffff18;
  errcxdef *in_stack_ffffffffffffff20;
  char *local_d0;
  uint *local_b8;
  uint *local_a0;
  uint *local_88;
  uint *local_70;
  uint *local_58;
  uint *local_40;
  char *local_30;
  uint local_24;
  uint *local_20;
  
  uVar1 = *(uint *)(in_RSI + 0xc);
  if (uVar1 == 0xffffffff) {
    local_40 = (uint *)0x0;
  }
  else {
    local_40 = (uint *)(*(long *)(in_RDI[6].errcxbuf + ((ulong)uVar1 / 2000) * 8 + 0xa4) +
                       ((ulong)uVar1 % 2000) * 8);
  }
  local_20 = local_40;
  while (local_20 != (uint *)0x0) {
    if ((((*(byte *)((long)local_20 + 7) & 8) != 0) && ((short)local_20[1] == in_CX)) &&
       (*(byte *)((long)local_20 + 6) == in_DX)) {
      *(byte *)((long)local_20 + 7) = *(byte *)((long)local_20 + 7) & 0xf7;
      return;
    }
    uVar1 = *local_20;
    if (uVar1 == 0xffffffff) {
      local_58 = (uint *)0x0;
    }
    else {
      local_58 = (uint *)(*(long *)(in_RDI[6].errcxbuf + ((ulong)uVar1 / 2000) * 8 + 0xa4) +
                         ((ulong)uVar1 % 2000) * 8);
    }
    local_20 = local_58;
  }
  uVar1 = *(uint *)(in_RSI + 0xc);
  if (uVar1 == 0xffffffff) {
    local_70 = (uint *)0x0;
  }
  else {
    local_70 = (uint *)(*(long *)(in_RDI[6].errcxbuf + ((ulong)uVar1 / 2000) * 8 + 0xa4) +
                       ((ulong)uVar1 % 2000) * 8);
  }
  local_20 = local_70;
  while( true ) {
    if (local_20 == (uint *)0x0) {
      if (*(int *)(in_RDI[6].errcxbuf + 0x128) == -1) {
        if (*(uint *)(in_RDI[6].errcxbuf + 0x124) % 2000 == 0) {
          uVar1 = *(uint *)(in_RDI[6].errcxbuf + 0x124) / 2000;
          if (0xf < uVar1) {
            errsigf(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,0);
          }
          puVar2 = mchalo(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                          (char *)in_stack_ffffffffffffff10);
          *(uchar **)(in_RDI[6].errcxbuf + (long)(int)uVar1 * 8 + 0xa4) = puVar2;
        }
        local_24 = *(uint *)(in_RDI[6].errcxbuf + 0x124);
        *(uint *)(in_RDI[6].errcxbuf + 0x124) = local_24 + 1;
        if (local_24 == 0xffffffff) {
          local_b8 = (uint *)0x0;
        }
        else {
          local_b8 = (uint *)(*(long *)(in_RDI[6].errcxbuf + ((ulong)local_24 / 2000) * 8 + 0xa4) +
                             ((ulong)local_24 % 2000) * 8);
        }
        local_20 = local_b8;
      }
      else {
        local_24 = *(uint *)(in_RDI[6].errcxbuf + 0x128);
        if (local_24 == 0xffffffff) {
          local_a0 = (uint *)0x0;
        }
        else {
          local_a0 = (uint *)(*(long *)(in_RDI[6].errcxbuf + ((ulong)local_24 / 2000) * 8 + 0xa4) +
                             ((ulong)local_24 % 2000) * 8);
        }
        local_20 = local_a0;
        *(uint *)(in_RDI[6].errcxbuf + 0x128) = *local_a0;
      }
      *local_20 = *(uint *)(in_RSI + 0xc);
      *(uint *)(in_RSI + 0xc) = local_24;
      *(char *)((long)local_20 + 6) = (char)in_DX;
      *(short *)(local_20 + 1) = in_CX;
      *(byte *)((long)local_20 + 7) = in_R8B;
      if (((in_DX == 2) && ((in_RDI[7].errcxbuf[0x186] & 2U) != 0)) &&
         ((*(byte *)((long)local_20 + 7) & 1) == 0)) {
        if (*(int *)(in_RSI + 0xc) == -1) {
          local_d0 = (char *)0x0;
        }
        else {
          local_d0 = (char *)(*(long *)(in_RDI[6].errcxbuf +
                                       ((ulong)*(uint *)(in_RSI + 0xc) / 2000) * 8 + 0xa4) +
                             ((ulong)*(uint *)(in_RSI + 0xc) % 2000) * 8);
          in_stack_ffffffffffffff20 = in_RDI;
        }
        local_30 = local_d0;
        while (err = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20), local_30 != (char *)0x0) {
          if ((((uint *)local_30 != local_20) && ((local_30[7] & 1U) == 0)) &&
             (local_30[6] == '\x02')) {
            len = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
            if (*(char *)(in_RSI + 9) != '\0') {
              pcVar3 = errstr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,len);
              in_RDI->errcxptr->errprv->erraav[0].errastr = pcVar3;
              pcVar3 = errstr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                              (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
              in_RDI->errcxptr->errprv->erraav[1].errastr = pcVar3;
              in_RDI->errcxptr->errprv->erraac = 2;
              errlogn(in_stack_ffffffffffffff10,err,(char *)0x15d16c);
              return;
            }
            pcVar3 = errstr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,len);
            in_RDI->errcxptr->errprv->erraav[0].errastr = pcVar3;
            in_RDI->errcxptr->errprv->erraac = 1;
            errlogn(in_stack_ffffffffffffff10,err,(char *)0x15d1dc);
            return;
          }
          if (*(uint *)local_30 == 0xffffffff) {
            in_stack_ffffffffffffff18 = (char *)0x0;
            local_30 = in_stack_ffffffffffffff18;
          }
          else {
            in_stack_ffffffffffffff10 =
                 *(errcxdef **)(in_RDI[6].errcxbuf + ((ulong)*(uint *)local_30 / 2000) * 8 + 0xa4);
            in_stack_ffffffffffffff18 =
                 in_stack_ffffffffffffff10->errcxbuf + ((ulong)*(uint *)local_30 % 2000) * 8 + -0x1c
            ;
            in_stack_ffffffffffffff08 = in_RDI;
            local_30 = in_stack_ffffffffffffff18;
          }
        }
      }
      return;
    }
    if ((((short)local_20[1] == in_CX) && (*(byte *)((long)local_20 + 6) == in_DX)) &&
       ((*(byte *)((long)local_20 + 7) & 1) == (in_R8B & 1))) break;
    uVar1 = *local_20;
    if (uVar1 == 0xffffffff) {
      local_88 = (uint *)0x0;
    }
    else {
      local_88 = (uint *)(*(long *)(in_RDI[6].errcxbuf + ((ulong)uVar1 / 2000) * 8 + 0xa4) +
                         ((ulong)uVar1 % 2000) * 8);
    }
    local_20 = local_88;
  }
  return;
}

Assistant:

static void vocwset(voccxdef *ctx, vocdef *v, prpnum p, objnum objn,
                    int classflg)
{
    vocwdef *vw;
    uint     inx;
    vocwdef *vw2;

    /*
     *   look through the vocdef list to see if there's an existing entry
     *   with the DELETED marker -- if so, simply undelete it 
     */
    for (inx = v->vocwlst, vw = vocwget(ctx, inx) ; vw ;
         inx = vw->vocwnxt, vw = vocwget(ctx, inx))
    {
        /* if this entry was deleted, and otherwise matches, undelete it */
        if ((vw->vocwflg & VOCFDEL)
            && vw->vocwobj == objn && vw->vocwtyp == p)
        {
            /*
             *   Remove the deleted flag.  We will otherwise leave the
             *   flags unchanged, since the VOCFDEL flag applies only to
             *   statically allocated objects, and hence the original
             *   flags should take precedence over any run-time flags. 
             */
            vw->vocwflg &= ~VOCFDEL;

            /* we're done */
            return;
        }
    }

    /* make sure the word+object+type record isn't already defined */
    for (inx = v->vocwlst, vw = vocwget(ctx, inx) ; vw ;
         inx = vw->vocwnxt, vw = vocwget(ctx, inx))
    {
        if (vw->vocwobj == objn && vw->vocwtyp == p
            && (vw->vocwflg & VOCFCLASS) == (classflg & VOCFCLASS))
        {
            /* it matches - don't add a redundant record */
            return;
        }
    }
    
    /* look in the free list for an available vocwdef */
    if (ctx->voccxwfre != VOCCXW_NONE)
    {
        inx = ctx->voccxwfre;
        vw = vocwget(ctx, inx);                     /* get the free vocwdef */
        ctx->voccxwfre = vw->vocwnxt;              /* unlink from free list */
    }
    else
    {
        /* allocate another page of vocwdef's if necssary */
        if ((ctx->voccxwalocnt % VOCWPGSIZ) == 0)
        {
            int pg = ctx->voccxwalocnt / VOCWPGSIZ;
            
            /* make sure we haven't exceeded the available page count */
            if (pg >= VOCWPGMAX) errsig(ctx->voccxerr, ERR_VOCMNPG);
            
            /* allocate on the new page */
#ifdef VOCW_IN_CACHE
            mcmalo(ctx->voccxmem, (ushort)(VOCWPGSIZ * sizeof(vocwdef)),
                                           &ctx->voccxwp[pg]);
            mcmunlck(ctx->voccxmem, ctx->voccxwp[pg]);
#else
            ctx->voccxwp[pg] =
                (vocwdef *)mchalo(ctx->voccxerr,
                                  (VOCWPGSIZ * sizeof(vocwdef)),
                                  "vocwset");
#endif
        }

        /* get the next entry, and increment count of used entries */
        inx = ctx->voccxwalocnt++;
        vw = vocwget(ctx, inx);
    }

    /* link the new vocwdef into the vocdef's relation list */
    vw->vocwnxt = v->vocwlst;
    v->vocwlst = inx;

    /* set up the new vocwdef */
    vw->vocwtyp = (uchar)p;
    vw->vocwobj = objn;
    vw->vocwflg = classflg;

    /* 
     *   Scan the list and make sure we're not adding a redundant verb.
     *   Don't bother with the warning if this is a class. 
     */
    if (p == PRP_VERB && (ctx->voccxflg & VOCCXFVWARN)
        && (vw->vocwflg & VOCFCLASS) == 0)
    {
        for (vw2 = vocwget(ctx, v->vocwlst) ; vw2 ;
             vw2 = vocwget(ctx, vw2->vocwnxt))
        {
            /* 
             *   if this is a different object, and it's not a class, and
             *   it's defined as a verb, warn about it 
             */
            if (vw2 != vw
                && (vw2->vocwflg & VOCFCLASS) == 0
                && vw2->vocwtyp == PRP_VERB)
            {
                if (v->vocln2 != 0)
                    errlog2(ctx->voccxerr, ERR_VOCREVB,
                            ERRTSTR,
                            errstr(ctx->voccxerr,
                                   (char *)v->voctxt, v->voclen),
                            ERRTSTR,
                            errstr(ctx->voccxerr,
                                   (char *)v->voctxt + v->voclen, v->vocln2));
                else
                    errlog1(ctx->voccxerr, ERR_VOCREVB,
                            ERRTSTR,
                            errstr(ctx->voccxerr,
                                   (char *)v->voctxt, v->voclen));
                break;
            }
        }
    }
}